

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::AddLinkPrefix(cmComputeLinkInformation *this,char *p)

{
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((p != (char *)0x0) && (*p != '\0')) {
    std::__cxx11::string::string((string *)&local_30,p,&local_31);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->LinkPrefixes,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddLinkPrefix(const char* p)
{
  if(p && *p)
    {
    this->LinkPrefixes.insert(p);
    }
}